

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::setCursorAbsoluteColumn(PatternModel *this,int absolute)

{
  long lVar1;
  int iVar2;
  int track;
  
  lVar1 = 0xdc;
  track = 0;
  do {
    iVar2 = absolute - *(int *)(&this->super_QObject + lVar1);
    if (absolute < *(int *)(&this->super_QObject + lVar1)) goto LAB_0016c9e8;
    lVar1 = lVar1 + 4;
    track = track + 1;
    absolute = iVar2;
  } while (lVar1 != 0xec);
  track = 3;
LAB_0016c9e8:
  setCursorTrack(this,track);
  setCursorColumn(this,absolute);
  return;
}

Assistant:

void PatternModel::setCursorAbsoluteColumn(int absolute) {
    // find the track
    int track = -1;
    for (auto max : mMaxColumns) {
        ++track;
        if (absolute < max) {
            break;
        }
        absolute -= max;
    }

    setCursorTrack(track);
    setCursorColumn(absolute);
}